

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void read_long_string(LexState *ls,SemInfo *seminfo,int sep)

{
  uint uVar1;
  size_t sVar2;
  byte *pbVar3;
  int iVar4;
  char *pcVar5;
  TString *pTVar6;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_34;
  char *msg;
  char *what;
  int line;
  int sep_local;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  uVar1 = ls->linenumber;
  save(ls,ls->current);
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_34 = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_34 = (uint)*pbVar3;
  }
  ls->current = local_34;
  if ((ls->current == 10) || (ls->current == 0xd)) {
    inclinenumber(ls);
  }
  do {
    while( true ) {
      while( true ) {
        iVar4 = ls->current;
        if (iVar4 == -1) {
          pcVar5 = "comment";
          if (seminfo != (SemInfo *)0x0) {
            pcVar5 = "string";
          }
          pcVar5 = luaO_pushfstring(ls->L,"unfinished long %s (starting at line %d)",pcVar5,
                                    (ulong)uVar1);
          lexerror(ls,pcVar5,0x121);
        }
        if ((iVar4 != 10) && (iVar4 != 0xd)) break;
        save(ls,10);
        inclinenumber(ls);
        if (seminfo == (SemInfo *)0x0) {
          ls->buff->n = 0;
        }
      }
      if (iVar4 == 0x5d) break;
      if (seminfo == (SemInfo *)0x0) {
        sVar2 = ls->z->n;
        ls->z->n = sVar2 - 1;
        if (sVar2 == 0) {
          local_44 = luaZ_fill(ls->z);
        }
        else {
          pbVar3 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar3 + 1);
          local_44 = (uint)*pbVar3;
        }
        ls->current = local_44;
      }
      else {
        save(ls,ls->current);
        sVar2 = ls->z->n;
        ls->z->n = sVar2 - 1;
        if (sVar2 == 0) {
          local_40 = luaZ_fill(ls->z);
        }
        else {
          pbVar3 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar3 + 1);
          local_40 = (uint)*pbVar3;
        }
        ls->current = local_40;
      }
    }
    iVar4 = skip_sep(ls);
  } while (iVar4 != sep);
  save(ls,ls->current);
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_3c = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_3c = (uint)*pbVar3;
  }
  ls->current = local_3c;
  if (seminfo != (SemInfo *)0x0) {
    pTVar6 = luaX_newstring(ls,ls->buff->buffer + (sep + 2),ls->buff->n - (long)((sep + 2) * 2));
    seminfo->ts = pTVar6;
  }
  return;
}

Assistant:

static void read_long_string(LexState *ls, SemInfo *seminfo, int sep) {
    int line = ls->linenumber;  /* initial line (for error message) */
    save_and_next(ls);  /* skip 2nd '[' */
    if (currIsNewline(ls))  /* string starts with a newline? */
        inclinenumber(ls);  /* skip it */
    for (;;) {
        switch (ls->current) {
            case EOZ: {  /* error */
                const char *what = (seminfo ? "string" : "comment");
                const char *msg = luaO_pushfstring(ls->L,
                                                   "unfinished long %s (starting at line %d)", what, line);
                lexerror(ls, msg, TK_EOS);
                break;  /* to avoid warnings */
            }
            case ']': {
                if (skip_sep(ls) == sep) {
                    save_and_next(ls);  /* skip 2nd ']' */
                    goto endloop;
                }
                break;
            }
            case '\n':
            case '\r': {
                save(ls, '\n');
                inclinenumber(ls);
                if (!seminfo) luaZ_resetbuffer(ls->buff);  /* avoid wasting space */
                break;
            }
            default: {
                if (seminfo) save_and_next(ls);
                else
                    next(ls);
            }
        }
    }
    endloop:
    if (seminfo)
        seminfo->ts = luaX_newstring(ls, luaZ_buffer(ls->buff) + (2 + sep),
                                     luaZ_bufflen(ls->buff) - 2 * (2 + sep));
}